

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

void __thiscall libtorrent::utp_socket_impl::send_syn(utp_socket_impl *this)

{
  uint8_t *p;
  _Atomic_word *p_Var1;
  utp_socket_manager *this_00;
  byte bVar2;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  packet *ppVar10;
  uint16_t uVar11;
  int iVar12;
  long lVar13;
  packet *ppVar14;
  uint val;
  uint uVar15;
  error_code ec;
  packet *local_88;
  packet *local_80;
  _Head_base<0UL,_libtorrent::packet_*,_false> local_78;
  error_code local_70;
  undefined1 local_60 [8];
  weak_ptr<libtorrent::utp_socket_interface> local_58;
  basic_endpoint<boost::asio::ip::udp> local_48;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  lVar13 = random((libtorrent *)0xffff);
  uVar11 = (uint16_t)lVar13;
  this->m_seq_nr = uVar11;
  this->m_acked_seq_nr = uVar11 - 1;
  this->m_loss_seq_nr = uVar11 - 1;
  this->m_ack_nr = 0;
  this->m_fast_resend_seq_nr = uVar11;
  packet_pool::alloc((packet_pool *)&local_88,(int)this->m_sm + 0x100);
  ppVar10 = local_88;
  local_88->size = 0x14;
  local_88->header_size = 0x14;
  *(undefined2 *)&local_88->field_0xe = 0x4100;
  p = local_88->buf;
  *(undefined1 *)
   &(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)&local_88[1].send_time.__d)
    ->_M_t).super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
    super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl = 0;
  *(uint16_t *)
   ((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
            &local_88[1].send_time.__d)->_M_t).
           super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
           super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 1) =
       this->m_recv_id << 8 | this->m_recv_id >> 8;
  uVar15 = this->m_reply_micro;
  uVar7 = (ushort)(uVar15 >> 0x10) & 0xff;
  uVar8 = (ushort)(uVar15 >> 8) & 0xff;
  uVar9 = (ushort)uVar15 & 0xff;
  bVar2 = (byte)(uVar15 >> 0x18);
  uVar6 = (ushort)bVar2;
  bVar2 = (uVar6 != 0) * (uVar6 < 0x100) * bVar2 - (0xff < uVar6);
  bVar3 = ((uVar15 & 0xff0000) != 0) * (uVar7 < 0x100) * (char)(uVar15 >> 0x10) - (0xff < uVar7);
  bVar4 = ((uVar15 & 0xff00) != 0) * (uVar8 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar8);
  bVar5 = ((uVar15 & 0xff) != 0) * (uVar9 < 0x100) * (char)uVar15 - (0xff < uVar9);
  *(uint *)((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
                    &local_88[1].send_time.__d)->_M_t).
                   super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
                   super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 7) =
       CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                         CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                  (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2))));
  *(undefined4 *)((long)&local_88[1].size + 1) = 0;
  uVar11 = this->m_seq_nr;
  local_88[1].buf[0] = (uint8_t)(uVar11 >> 8);
  *(char *)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
             &local_88[2].send_time.__d)->_M_t).
            super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
            super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl = (char)uVar11;
  *(undefined2 *)
   ((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
            &local_88[2].send_time.__d)->_M_t).
           super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
           super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 1) = 0;
  ppVar14 = (packet *)std::chrono::_V2::system_clock::now();
  (((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)&(local_88->send_time).__d)->
  _M_t).super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
  super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl = ppVar14;
  uVar15 = (int)(SUB168(SEXT816((long)ppVar14) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
           (SUB164(SEXT816((long)ppVar14) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f);
  uVar7 = (ushort)((uVar15 & 0xff00ff) >> 0x10);
  uVar8 = (ushort)(uVar15 >> 8) & 0xff;
  uVar9 = (ushort)(uVar15 & 0xff00ff);
  bVar2 = (byte)(uVar15 >> 0x18);
  uVar6 = (ushort)bVar2;
  bVar2 = (uVar6 != 0) * (uVar6 < 0x100) * bVar2 - (0xff < uVar6);
  bVar3 = ((uVar15 & 0xff0000) != 0) * (uVar7 < 0x100) * (char)(uVar15 >> 0x10) - (0xff < uVar7);
  bVar4 = ((uVar15 & 0xff00) != 0) * (uVar8 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar8);
  bVar5 = ((uVar15 & 0xff) != 0) * (uVar9 < 0x100) * (char)uVar15 - (0xff < uVar9);
  *(uint *)((long)&(((__uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter> *)
                    &ppVar10[1].send_time.__d)->_M_t).
                   super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
                   super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl + 3) =
       CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                         CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                  (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2))));
  local_70.val_ = 0;
  local_70._4_4_ = local_70._4_4_ & 0xffffff00;
  local_70.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this_00 = this->m_sm;
  local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_sock).super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->m_sock).super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_48,&this->m_remote_address,this->m_port);
  utp_socket_manager::send_packet
            (this_00,&local_58,&local_48,(char *)p,0x14,&local_70,(udp_send_flags_t)0x0);
  if (local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_58.
                 super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar12 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar12 = (local_58.
                super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_weak_count;
      (local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar12 + -1;
    }
    if (iVar12 == 1) {
      (*(local_58.super___weak_ptr<libtorrent::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((local_70.val_ == 0xb) && ((local_70.cat_)->id_ == 0x8fafd21e25c5e09b)) {
    if ((*(ushort *)&this->field_0x21a >> 0xd & 1) == 0) {
      *(ushort *)&this->field_0x21a = *(ushort *)&this->field_0x21a | 0x2000;
      utp_socket_manager::subscribe_writable(this->m_sm,this);
    }
  }
  else if (local_70.failed_ == true) {
    local_78._M_head_impl = local_88;
    local_88 = (packet *)0x0;
    release_packet(this,(packet_ptr *)&local_78);
    if (local_78._M_head_impl != (packet *)0x0) {
      free(local_78._M_head_impl);
    }
    local_78._M_head_impl = (packet *)0x0;
    (this->m_error).val_ = local_70.val_;
    (this->m_error).failed_ = (bool)local_70.failed_;
    *(int3 *)&(this->m_error).field_0x5 = local_70._5_3_;
    (this->m_error).cat_ = local_70.cat_;
    set_state(this,4);
    test_socket_state(this);
    goto LAB_0031fb2a;
  }
  if ((this->field_0x21b & 0x20) == 0) {
    local_88->field_0xe = local_88->field_0xe & 0xc0 | local_88->field_0xe + 1 & 0x3f;
  }
  local_80 = local_88;
  local_88 = (packet *)0x0;
  packet_buffer::insert
            ((packet_buffer *)local_60,(int)this + 0xc0,(packet_ptr *)(ulong)this->m_seq_nr);
  if ((tuple<std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>[]>_>
       )local_60 !=
      (_Head_base<0UL,_std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>_*,_false>)0x0
     ) {
    free((void *)local_60);
  }
  local_60 = (undefined1  [8])0x0;
  if (local_80 != (packet *)0x0) {
    free(local_80);
  }
  local_80 = (packet *)0x0;
  this->m_seq_nr = this->m_seq_nr + 1;
  set_state(this,1);
LAB_0031fb2a:
  if (local_88 != (packet *)0x0) {
    free(local_88);
  }
  return;
}

Assistant:

void utp_socket_impl::send_syn()
{
	INVARIANT_CHECK;

	m_seq_nr = std::uint16_t(random(0xffff));
	m_acked_seq_nr = (m_seq_nr - 1) & ACK_MASK;
	m_loss_seq_nr = m_acked_seq_nr;
	m_ack_nr = 0;
	m_fast_resend_seq_nr = m_seq_nr;

	packet_ptr p = acquire_packet(sizeof(utp_header));
	p->size = sizeof(utp_header);
	p->header_size = sizeof(utp_header);
	p->num_transmissions = 0;
	p->mtu_probe = false;
#if TORRENT_USE_ASSERTS
	p->num_fast_resend = 0;
#endif
	p->need_resend = false;
	auto* h = reinterpret_cast<utp_header*>(p->buf);
	h->type_ver = (ST_SYN << 4) | 1;
	h->extension = utp_no_extension;
	// using recv_id here is intentional! This is an odd
	// thing in uTP. The syn packet is sent with the connection
	// ID that it expects to receive the syn ack on. All
	// subsequent connection IDs will be this plus one.
	h->connection_id = m_recv_id;
	h->timestamp_difference_microseconds = m_reply_micro;
	h->wnd_size = 0;
	h->seq_nr = m_seq_nr;
	h->ack_nr = 0;

	time_point const now = clock_type::now();
	p->send_time = now;
	h->timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: send_syn seq_nr:%d id:%d target:%s\n"
		, static_cast<void*>(this), int(m_seq_nr), int(m_recv_id)
		, print_endpoint(udp::endpoint(m_remote_address, m_port)).c_str());
#endif

	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(h) , sizeof(utp_header), ec);

	if (ec == error::would_block || ec == error::try_again)
	{
#if TORRENT_UTP_LOG
		UTP_LOGV("%8p: socket stalled\n", static_cast<void*>(this));
#endif
		if (!m_stalled)
		{
			m_stalled = true;
			m_sm.subscribe_writable(this);
		}
	}
	else if (ec)
	{
		release_packet(std::move(p));
		m_error = ec;
		set_state(UTP_STATE_ERROR_WAIT);
		test_socket_state();
		return;
	}

	if (!m_stalled)
		++p->num_transmissions;

	TORRENT_ASSERT(!m_outbuf.at(m_seq_nr));
	TORRENT_ASSERT(h->seq_nr == m_seq_nr);
	TORRENT_ASSERT(p->buf == reinterpret_cast<std::uint8_t*>(h));
	m_outbuf.insert(m_seq_nr, std::move(p));

	m_seq_nr = (m_seq_nr + 1) & ACK_MASK;

	TORRENT_ASSERT(!m_error);
	set_state(UTP_STATE_SYN_SENT);
#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: state:%s\n", static_cast<void*>(this), socket_state_names[m_state]);
#endif
}